

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  Schema *pSVar4;
  _ht *p_Var5;
  Vdbe *p;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  HashElem *pHVar11;
  Vdbe **ppVVar12;
  long lVar13;
  int nByte;
  int *local_58;
  int local_50;
  int nByte_1;
  int *local_48;
  ulong local_40;
  long local_38;
  
  local_58 = pHighwater;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    *pCurrent = (db->lookaside).nOut;
    *local_58 = (db->lookaside).mxOut;
    iVar10 = 0;
    if (resetFlag != 0) {
      (db->lookaside).mxOut = (db->lookaside).nOut;
    }
    goto LAB_00113243;
  case 1:
  case 0xb:
    local_48 = pCurrent;
    sqlite3BtreeEnterAll(db);
    lVar9 = 8;
    iVar10 = 0;
    local_40 = (ulong)(uint)op;
    for (lVar13 = 0; lVar13 < db->nDb; lVar13 = lVar13 + 1) {
      lVar2 = *(long *)((long)&db->aDb->zDbSName + lVar9);
      if (lVar2 != 0) {
        pvVar3 = (void *)**(undefined8 **)(lVar2 + 8);
        iVar7 = *(int *)((long)pvVar3 + 0xbc);
        uVar1 = *(ushort *)((long)pvVar3 + 0xb0);
        local_50 = iVar10;
        local_38 = lVar9;
        iVar10 = (*sqlite3Config.pcache2.xPagecount)
                           (*(sqlite3_pcache **)(*(long *)((long)pvVar3 + 0x118) + 0x40));
        iVar6 = (*sqlite3Config.m.xSize)(pvVar3);
        iVar10 = iVar6 + iVar10 * (iVar7 + (uint)uVar1 + 0x70) + *(int *)((long)pvVar3 + 0xbc);
        if ((int)local_40 == 0xb) {
          iVar10 = iVar10 / *(int *)(*(long *)(lVar2 + 8) + 0x60);
        }
        iVar10 = local_50 + iVar10;
        lVar9 = local_38;
      }
      lVar9 = lVar9 + 0x20;
    }
    sqlite3BtreeLeaveAll(db);
    *local_48 = iVar10;
    *local_58 = 0;
    goto LAB_00113240;
  case 2:
    nByte = 0;
    sqlite3BtreeEnterAll(db);
    db->pnBytesFreed = &nByte;
    for (lVar9 = 0; lVar9 < db->nDb; lVar9 = lVar9 + 1) {
      pSVar4 = db->aDb[lVar9].pSchema;
      if (pSVar4 != (Schema *)0x0) {
        iVar10 = (*sqlite3Config.m.xRoundup)(0x20);
        nByte = ((pSVar4->trigHash).count + (pSVar4->tblHash).count + (pSVar4->idxHash).count +
                (pSVar4->fkeyHash).count) * iVar10 + nByte;
        p_Var5 = (pSVar4->tblHash).ht;
        iVar7 = 0;
        iVar10 = 0;
        if (p_Var5 != (_ht *)0x0) {
          iVar10 = (*sqlite3Config.m.xSize)(p_Var5);
        }
        nByte = nByte + iVar10;
        p_Var5 = (pSVar4->trigHash).ht;
        if (p_Var5 != (_ht *)0x0) {
          iVar7 = (*sqlite3Config.m.xSize)(p_Var5);
        }
        nByte = nByte + iVar7;
        p_Var5 = (pSVar4->idxHash).ht;
        iVar7 = 0;
        iVar10 = 0;
        if (p_Var5 != (_ht *)0x0) {
          iVar10 = (*sqlite3Config.m.xSize)(p_Var5);
        }
        nByte = nByte + iVar10;
        p_Var5 = (pSVar4->fkeyHash).ht;
        if (p_Var5 != (_ht *)0x0) {
          iVar7 = (*sqlite3Config.m.xSize)(p_Var5);
        }
        nByte = nByte + iVar7;
        pHVar11 = (HashElem *)&(pSVar4->trigHash).first;
        while (pHVar11 = pHVar11->next, pHVar11 != (HashElem *)0x0) {
          sqlite3DeleteTrigger(db,(Trigger *)pHVar11->data);
        }
        pHVar11 = (HashElem *)&(pSVar4->tblHash).first;
        while (pHVar11 = pHVar11->next, pHVar11 != (HashElem *)0x0) {
          sqlite3DeleteTable(db,(Table *)pHVar11->data);
        }
      }
    }
    db->pnBytesFreed = (int *)0x0;
    sqlite3BtreeLeaveAll(db);
    *local_58 = 0;
    uVar8 = nByte;
    break;
  case 3:
    nByte_1 = 0;
    db->pnBytesFreed = &nByte_1;
    ppVVar12 = &db->pVdbe;
    while (p = *ppVVar12, p != (Vdbe *)0x0) {
      sqlite3VdbeClearObject(db,p);
      sqlite3DbFreeNN(db,p);
      ppVVar12 = &p->pNext;
    }
    db->pnBytesFreed = (int *)0x0;
    *local_58 = 0;
    uVar8 = nByte_1;
    break;
  case 4:
  case 5:
  case 6:
    *pCurrent = 0;
    *local_58 = (db->lookaside).anStat[op - 4U];
    iVar10 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[op - 4U] = 0;
    }
    goto LAB_00113243;
  case 7:
  case 8:
  case 9:
    lVar9 = 8;
    iVar10 = 0;
    for (lVar13 = 0; lVar13 < db->nDb; lVar13 = lVar13 + 1) {
      lVar2 = *(long *)((long)&db->aDb->zDbSName + lVar9);
      if (lVar2 != 0) {
        lVar2 = **(long **)(lVar2 + 8);
        iVar10 = iVar10 + *(int *)(lVar2 + 0xf0 + (ulong)(op - 7) * 4);
        if (resetFlag != 0) {
          *(undefined4 *)(lVar2 + 0xf0 + (ulong)(op - 7) * 4) = 0;
        }
      }
      lVar9 = lVar9 + 0x20;
    }
    *local_58 = 0;
    *pCurrent = iVar10;
    goto LAB_00113240;
  case 10:
    *local_58 = 0;
    if (db->nDeferredImmCons < 1) {
      uVar8 = (uint)(0 < db->nDeferredCons);
    }
    else {
      uVar8 = 1;
    }
    break;
  default:
    iVar10 = 1;
    goto LAB_00113243;
  }
  *pCurrent = uVar8;
LAB_00113240:
  iVar10 = 0;
LAB_00113243:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar10;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = db->lookaside.nOut;
      *pHighwater = db->lookaside.mxOut;
      if( resetFlag ){
        db->lookaside.mxOut = db->lookaside.nOut;
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /* 
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count 
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pNext){
        sqlite3VdbeClearObject(db, pVdbe);
        sqlite3DbFree(db, pVdbe);
      }
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set 
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = nRet;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}